

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_sample.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DuckDBTableSampleBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  TableCatalogEntry *pTVar1;
  pointer pLVar2;
  undefined8 this_00;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  reference this_01;
  ColumnDefinition *this_02;
  _func_int **pp_Var4;
  NotImplementedException *this_03;
  LogicalIndex idx;
  LogicalType *type;
  pointer __x;
  vector<duckdb::LogicalType,_true> types;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  QualifiedName qname;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_d0;
  undefined1 local_b8 [32];
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_98;
  QualifiedName local_90;
  
  local_98._M_head_impl = (FunctionData *)this;
  this_01 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  Value::GetValue<std::__cxx11::string>((string *)local_b8,this_01);
  QualifiedName::Parse(&local_90,(string *)local_b8);
  pTVar1 = (TableCatalogEntry *)(local_b8 + 0x10);
  if ((TableCatalogEntry *)local_b8._0_8_ != pTVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
  Binder::BindSchemaOrCatalog(context,&local_90.catalog,&local_90.schema);
  local_b8._0_8_ =
       Catalog::GetEntry<duckdb::TableCatalogEntry>
                 (context,&local_90.catalog,&local_90.schema,&local_90.name,THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_b8);
  this_00 = local_b8._0_8_;
  if (*(CatalogType *)(local_b8._0_8_ + 0x10) == TABLE_ENTRY) {
    TableCatalogEntry::GetTypes
              ((vector<duckdb::LogicalType,_true> *)&local_d0,(TableCatalogEntry *)local_b8._0_8_);
    pLVar2 = local_d0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (__x = local_d0.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start; __x != pLVar2; __x = __x + 1) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&return_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
    }
    if (local_d0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_d0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      idx.index = 0;
      do {
        this_02 = TableCatalogEntry::GetColumn((TableCatalogEntry *)this_00,idx);
        ColumnDefinition::GetName_abi_cxx11_((string *)local_b8,this_02);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
                   (string *)local_b8);
        if ((TableCatalogEntry *)local_b8._0_8_ != pTVar1) {
          operator_delete((void *)local_b8._0_8_);
        }
        idx.index = idx.index + 1;
      } while (idx.index <
               (ulong)(((long)local_d0.
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_d0.
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              );
    }
    pp_Var4 = (_func_int **)operator_new(0x28);
    _Var3._M_head_impl = local_98._M_head_impl;
    pp_Var4[1] = (_func_int *)0x0;
    pp_Var4[2] = (_func_int *)0x0;
    pp_Var4[3] = (_func_int *)0x0;
    *pp_Var4 = (_func_int *)&PTR__TableFunctionData_0249c5d0;
    pp_Var4[4] = (_func_int *)this_00;
    (local_98._M_head_impl)->_vptr_FunctionData = pp_Var4;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
      operator_delete(local_90.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.schema._M_dataplus._M_p != &local_90.schema.field_2) {
      operator_delete(local_90.schema._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.catalog._M_dataplus._M_p != &local_90.catalog.field_2) {
      operator_delete(local_90.catalog._M_dataplus._M_p);
    }
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           _Var3._M_head_impl;
  }
  this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_b8._0_8_ = pTVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Invalid Catalog type passed to table_sample()","");
  NotImplementedException::NotImplementedException(this_03,(string *)local_b8);
  __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> DuckDBTableSampleBind(ClientContext &context, TableFunctionBindInput &input,
                                                      vector<LogicalType> &return_types, vector<string> &names) {

	// look up the table name in the catalog
	auto qname = QualifiedName::Parse(input.inputs[0].GetValue<string>());
	Binder::BindSchemaOrCatalog(context, qname.catalog, qname.schema);

	auto &entry = Catalog::GetEntry<TableCatalogEntry>(context, qname.catalog, qname.schema, qname.name);
	if (entry.type != CatalogType::TABLE_ENTRY) {
		throw NotImplementedException("Invalid Catalog type passed to table_sample()");
	}
	auto &table_entry = entry.Cast<TableCatalogEntry>();
	auto types = table_entry.GetTypes();
	for (auto &type : types) {
		return_types.push_back(type);
	}
	for (idx_t i = 0; i < types.size(); i++) {
		auto logical_index = LogicalIndex(i);
		auto &col = table_entry.GetColumn(logical_index);
		names.push_back(col.GetName());
	}

	return make_uniq<DuckDBTableSampleFunctionData>(entry);
}